

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall Highs::appendNonbasicColsToBasisInterface(Highs *this,HighsInt ext_num_new_col)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  byte bVar9;
  int in_ESI;
  long in_RDI;
  int8_t move;
  HighsBasisStatus status;
  double upper;
  double lower;
  HighsInt iCol_1;
  HighsInt iCol;
  HighsInt iRow;
  HighsInt newNumTot;
  HighsInt newNumCol;
  HighsLp *lp;
  SimplexBasis *simplex_basis;
  bool has_simplex_basis;
  HighsBasis *highs_basis;
  value_type local_5a;
  value_type local_59;
  size_type in_stack_ffffffffffffffa8;
  double val;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *in_stack_ffffffffffffffb0;
  value_type vVar10;
  int local_44;
  int local_3c;
  
  if ((in_ESI != 0) && ((*(byte *)(in_RDI + 0x72) & 1) != 0)) {
    bVar9 = *(byte *)(in_RDI + 0x384c) & 1;
    piVar4 = (int *)(in_RDI + 0x138);
    iVar3 = *piVar4 + in_ESI;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (bVar9 != 0) {
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
      local_3c = *(int *)(in_RDI + 0x13c);
      while (local_3c = local_3c + -1, -1 < local_3c) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3c70),(long)local_3c);
        if (*piVar4 <= *pvVar5) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3c70),(long)local_3c)
          ;
          *pvVar5 = in_ESI + *pvVar5;
        }
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x3c88),
                            (long)(*piVar4 + local_3c));
        vVar1 = *pvVar6;
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x3c88),
                            (long)(iVar3 + local_3c));
        *pvVar6 = vVar1;
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x3ca0),
                            (long)(*piVar4 + local_3c));
        vVar1 = *pvVar6;
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x3ca0),
                            (long)(iVar3 + local_3c));
        *pvVar6 = vVar1;
      }
    }
    for (local_44 = *piVar4; local_44 < iVar3; local_44 = local_44 + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x158),(long)local_44
                         );
      vVar10 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x170),(long)local_44
                         );
      val = *pvVar7;
      if ((vVar10 != val) || (NAN(vVar10) || NAN(val))) {
        bVar2 = highs_isInfinity(-vVar10);
        if (bVar2) {
          bVar2 = highs_isInfinity(val);
          if (bVar2) {
            local_59 = kZero;
            local_5a = '\0';
          }
          else {
            local_59 = kUpper;
            local_5a = -1;
          }
        }
        else {
          bVar2 = highs_isInfinity(val);
          if (bVar2) {
            local_59 = kLower;
            local_5a = '\x01';
          }
          else if (ABS(val) <= ABS(vVar10)) {
            local_59 = kUpper;
            local_5a = -1;
          }
          else {
            local_59 = kLower;
            local_5a = '\x01';
          }
        }
      }
      else {
        local_59 = kLower;
        local_5a = '\0';
      }
      pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RDI + 0xa0),(long)local_44);
      *pvVar8 = local_59;
      if (bVar9 != 0) {
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x3c88),
                            (long)local_44);
        *pvVar6 = '\x01';
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x3ca0),
                            (long)local_44);
        *pvVar6 = local_5a;
      }
    }
  }
  return;
}

Assistant:

void Highs::appendNonbasicColsToBasisInterface(const HighsInt ext_num_new_col) {
  if (ext_num_new_col == 0) return;
  HighsBasis& highs_basis = basis_;
  if (!highs_basis.useful) return;
  const bool has_simplex_basis = ekk_instance_.status_.has_basis;
  SimplexBasis& simplex_basis = ekk_instance_.basis_;
  HighsLp& lp = model_.lp_;

  assert(highs_basis.col_status.size() == static_cast<size_t>(lp.num_col_));
  assert(highs_basis.row_status.size() == static_cast<size_t>(lp.num_row_));

  // Add nonbasic structurals
  HighsInt newNumCol = lp.num_col_ + ext_num_new_col;
  HighsInt newNumTot = newNumCol + lp.num_row_;
  highs_basis.col_status.resize(newNumCol);
  if (has_simplex_basis) {
    simplex_basis.nonbasicFlag_.resize(newNumTot);
    simplex_basis.nonbasicMove_.resize(newNumTot);
    // Shift the row data in basicIndex, nonbasicFlag and nonbasicMove if
    // necessary
    for (HighsInt iRow = lp.num_row_ - 1; iRow >= 0; iRow--) {
      HighsInt iCol = simplex_basis.basicIndex_[iRow];
      if (iCol >= lp.num_col_) {
        // This basic variable is a row, so shift its index
        simplex_basis.basicIndex_[iRow] += ext_num_new_col;
      }
      simplex_basis.nonbasicFlag_[newNumCol + iRow] =
          simplex_basis.nonbasicFlag_[lp.num_col_ + iRow];
      simplex_basis.nonbasicMove_[newNumCol + iRow] =
          simplex_basis.nonbasicMove_[lp.num_col_ + iRow];
    }
  }
  // Make any new columns nonbasic
  for (HighsInt iCol = lp.num_col_; iCol < newNumCol; iCol++) {
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    int8_t move = kIllegalMoveValue;
    if (lower == upper) {
      // Fixed
      status = HighsBasisStatus::kLower;
      move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        if (fabs(lower) < fabs(upper)) {
          status = HighsBasisStatus::kLower;
          move = kNonbasicMoveUp;
        } else {
          status = HighsBasisStatus::kUpper;
          move = kNonbasicMoveDn;
        }
      } else {
        // Lower (since upper bound is infinite)
        status = HighsBasisStatus::kLower;
        move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      status = HighsBasisStatus::kUpper;
      move = kNonbasicMoveDn;
    } else {
      // FREE
      status = HighsBasisStatus::kZero;
      move = kNonbasicMoveZe;
    }
    assert(status != HighsBasisStatus::kNonbasic);
    highs_basis.col_status[iCol] = status;
    if (has_simplex_basis) {
      assert(move != kIllegalMoveValue);
      simplex_basis.nonbasicFlag_[iCol] = kNonbasicFlagTrue;
      simplex_basis.nonbasicMove_[iCol] = move;
    }
  }
}